

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O0

process_events_map_t *
tchecker::system::weakly_synchronized_events
          (process_events_map_t *__return_storage_ptr__,system_t *system)

{
  bool bVar1;
  sync_strength_t sVar2;
  process_id_t pid;
  event_id_t event_id;
  size_t sVar3;
  __normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>
  *p_Var4;
  reference this;
  __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
  *p_Var5;
  reference this_00;
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
  rVar6;
  sync_constraint_t *sc;
  __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
  __end3;
  __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
  __begin3;
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
  *__range3;
  synchronization_t *sync;
  __normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>
  __end2;
  __normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>
  __begin2;
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>_>
  local_38;
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>_>
  *local_28;
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>_>
  *__range2;
  system_t *local_18;
  system_t *system_local;
  process_events_map_t *weak_sync_map;
  
  __range2._7_1_ = 0;
  local_18 = system;
  system_local = (system_t *)__return_storage_ptr__;
  sVar3 = processes_t::processes_count(&system->super_processes_t);
  process_events_map_t::process_events_map_t(__return_storage_ptr__,(process_id_t)sVar3);
  local_38 = synchronizations_t::synchronizations(&local_18->super_synchronizations_t);
  local_28 = &local_38;
  p_Var4 = range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>_>
           ::begin(local_28);
  __end2._M_current = p_Var4->_M_current;
  p_Var4 = range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>_>
           ::end(local_28);
  sync = p_Var4->_M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>
                                *)&sync);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>
           ::operator*(&__end2);
    rVar6 = synchronization_t::synchronization_constraints(this);
    __begin3 = rVar6._begin._M_current;
    p_Var5 = range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
             ::begin((range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
                      *)&__begin3);
    __end3._M_current = p_Var5->_M_current;
    p_Var5 = range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
             ::end((range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
                    *)&__begin3);
    sc = p_Var5->_M_current;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
                                  *)&sc);
      if (!bVar1) break;
      this_00 = __gnu_cxx::
                __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
                ::operator*(&__end3);
      sVar2 = sync_constraint_t::strength(this_00);
      if (sVar2 == SYNC_WEAK) {
        pid = sync_constraint_t::pid(this_00);
        event_id = sync_constraint_t::event_id(this_00);
        process_events_map_t::insert(__return_storage_ptr__,pid,event_id);
      }
      __gnu_cxx::
      __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

tchecker::system::process_events_map_t weakly_synchronized_events(tchecker::system::system_t const & system)
{
  tchecker::system::process_events_map_t weak_sync_map(system.processes_count());
  for (tchecker::system::synchronization_t const & sync : system.synchronizations()) {
    for (tchecker::system::sync_constraint_t const & sc : sync.synchronization_constraints())
      if (sc.strength() == tchecker::SYNC_WEAK)
        weak_sync_map.insert(sc.pid(), sc.event_id());
  }
  return weak_sync_map;
}